

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonPP.cpp
# Opt level: O2

Value * ccd::Json::arrayFromString(Value *__return_storage_ptr__,string *jsonString)

{
  Type TVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  _Uninitialized<double,_true> _Var6;
  ostream *poVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  char cVar11;
  Value subObject;
  _List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_> local_70;
  double value_1;
  double local_38;
  
  setlocale(1,"C");
  local_70._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_70;
  local_70._M_impl._M_node._M_size = 0;
  cVar11 = (char)jsonString;
  local_70._M_impl._M_node.super__List_node_base._M_prev =
       local_70._M_impl._M_node.super__List_node_base._M_next;
  lVar2 = std::__cxx11::string::find(cVar11,0x5b);
  lVar3 = std::__cxx11::string::rfind(cVar11,0x5d);
  if ((lVar2 == -1) || (lVar3 == -1)) {
    poVar7 = std::operator<<((ostream *)&std::cout,"can\'t tell beginning or end of array");
    std::endl<char,std::char_traits<char>>(poVar7);
    Value::Value(__return_storage_ptr__,(nullptr_t)0x0);
  }
  else {
    do {
      subObject._0_8_ =
           (long)&subObject.m_value.
                  super__Variant_base<int,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>,_std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>_>
                  .
                  super__Move_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
                  .
                  super__Copy_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
                  .
                  super__Move_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
                  .
                  super__Copy_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
           + 8;
      subObject.m_value.
      super__Variant_base<int,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>,_std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>_>
      .
      super__Move_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
      .
      super__Copy_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
      .
      super__Move_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
      .
      super__Copy_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
      .
      super__Variant_storage_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
      ._M_u._12_1_ = 0;
      subObject.m_value.
      super__Variant_base<int,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>,_std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>_>
      .
      super__Move_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
      .
      super__Copy_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
      .
      super__Move_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
      .
      super__Copy_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
      .
      super__Variant_storage_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
      ._M_u._8_4_ = 0xd0a0920;
      subObject.m_value.
      super__Variant_base<int,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>,_std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>_>
      .
      super__Move_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
      .
      super__Copy_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
      .
      super__Move_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
      .
      super__Copy_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
      .
      super__Variant_storage_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
      ._M_u._M_rest._0_8_ = (undefined8)1.97626258336499e-323;
      uVar4 = std::__cxx11::string::find_first_not_of((string *)jsonString,(ulong)&subObject);
      std::__cxx11::string::~string((string *)&subObject);
      if (uVar4 == 0xffffffffffffffff) {
LAB_0011484c:
        std::vector<ccd::Json::Value,std::allocator<ccd::Json::Value>>::
        vector<std::move_iterator<std::_List_iterator<ccd::Json::Value>>,void>
                  ((vector<ccd::Json::Value,std::allocator<ccd::Json::Value>> *)&subObject,
                   (move_iterator<std::_List_iterator<ccd::Json::Value>_>)
                   local_70._M_impl._M_node.super__List_node_base._M_next,
                   (move_iterator<std::_List_iterator<ccd::Json::Value>_>)&local_70,
                   (allocator_type *)&value_1);
        Value::Value(__return_storage_ptr__,(Array *)&subObject);
        std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>::~vector
                  ((vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_> *)&subObject);
        goto LAB_00114977;
      }
      pcVar5 = (char *)std::__cxx11::string::at((ulong)jsonString);
      if (*pcVar5 == '{') {
        std::__cxx11::string::substr((ulong)&subObject,(ulong)jsonString);
        iVar9 = 0;
        iVar8 = 0;
        for (_Var6._M_storage = 0.0; iVar10 = iVar9,
            subObject.m_value.
            super__Variant_base<int,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>,_std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>_>
            .
            super__Move_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
            .
            super__Copy_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
            .
            super__Move_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
            .
            super__Copy_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
            .
            super__Variant_storage_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
            ._M_u._M_rest._M_first._M_storage != (_Uninitialized<double,_true>)_Var6._M_storage;
            _Var6._M_storage = _Var6._M_storage + 1) {
          iVar8 = iVar8 + (uint)(*(char *)(subObject._0_8_ + (long)_Var6._M_storage) == '{');
          iVar9 = iVar9 + (uint)(*(char *)(subObject._0_8_ + (long)_Var6._M_storage) == '}');
          iVar10 = iVar8;
          if (iVar8 == iVar9) break;
        }
        std::__cxx11::string::~string((string *)&subObject);
        if (iVar8 != iVar10) {
          poVar7 = std::operator<<((ostream *)&std::cout,"could not tell end of new subObject");
          std::endl<char,std::char_traits<char>>(poVar7);
          Value::Value(__return_storage_ptr__,(nullptr_t)0x0);
          goto LAB_00114977;
        }
        std::__cxx11::string::substr((ulong)&value_1,(ulong)jsonString);
        objectFromString(&subObject,(string *)&value_1);
        std::__cxx11::string::~string((string *)&value_1);
        TVar1 = Value::type(&subObject);
        if (TVar1 == Null) {
          poVar7 = std::operator<<((ostream *)&std::cout,"subObject ist nullptr");
          std::endl<char,std::char_traits<char>>(poVar7);
          Value::Value(__return_storage_ptr__,(nullptr_t)0x0);
        }
        else {
          std::__cxx11::list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>::push_back
                    ((list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_> *)&local_70,
                     &subObject);
        }
        std::__detail::__variant::
        _Variant_storage<false,_int,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>,_std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>_>
        ::~_Variant_storage((_Variant_storage<false,_int,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>,_std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>_>
                             *)&subObject.m_value);
        if (TVar1 == Null) goto LAB_00114977;
      }
      else {
        pcVar5 = (char *)std::__cxx11::string::at((ulong)jsonString);
        if (*pcVar5 == '\"') {
          lVar2 = std::__cxx11::string::find(cVar11,0x22);
          if (lVar2 == -1) {
            poVar7 = std::operator<<((ostream *)&std::cout,"cant find end of value");
            std::endl<char,std::char_traits<char>>(poVar7);
            Value::Value(__return_storage_ptr__,(nullptr_t)0x0);
            goto LAB_00114977;
          }
          std::__cxx11::string::substr((ulong)&subObject,(ulong)jsonString);
          std::__cxx11::list<ccd::Json::Value,std::allocator<ccd::Json::Value>>::
          emplace_back<std::__cxx11::string>
                    ((list<ccd::Json::Value,std::allocator<ccd::Json::Value>> *)&local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&subObject
                    );
          std::__cxx11::string::~string((string *)&subObject);
        }
        else {
          pcVar5 = (char *)std::__cxx11::string::at((ulong)jsonString);
          if (((int)*pcVar5 - 0x30U < 10) ||
             (pcVar5 = (char *)std::__cxx11::string::at((ulong)jsonString), *pcVar5 == '-')) {
            do {
              pcVar5 = (char *)std::__cxx11::string::at((ulong)jsonString);
            } while ((int)*pcVar5 - 0x30U < 10);
            pcVar5 = (char *)std::__cxx11::string::at((ulong)jsonString);
            if (*pcVar5 == '.') {
              pcVar5 = (char *)std::__cxx11::string::at((ulong)jsonString);
              if (9 < (int)*pcVar5 - 0x30U) {
                poVar7 = std::operator<<((ostream *)&std::cout,"exptected digit");
                std::endl<char,std::char_traits<char>>(poVar7);
                Value::Value(__return_storage_ptr__,(nullptr_t)0x0);
                goto LAB_00114977;
              }
              do {
                pcVar5 = (char *)std::__cxx11::string::at((ulong)jsonString);
              } while ((int)*pcVar5 - 0x30U < 10);
              std::__cxx11::string::substr((ulong)&subObject,(ulong)jsonString);
              local_38 = std::__cxx11::stod((string *)&subObject,(size_t *)0x0);
              std::__cxx11::string::~string((string *)&subObject);
              value_1 = local_38;
              std::__cxx11::list<ccd::Json::Value,std::allocator<ccd::Json::Value>>::
              emplace_back<double&>
                        ((list<ccd::Json::Value,std::allocator<ccd::Json::Value>> *)&local_70,
                         &value_1);
            }
            else {
              std::__cxx11::string::substr((ulong)&subObject,(ulong)jsonString);
              iVar8 = std::__cxx11::stoi((string *)&subObject,(size_t *)0x0,10);
              std::__cxx11::string::~string((string *)&subObject);
              value_1 = (double)CONCAT44(value_1._4_4_,iVar8);
              std::__cxx11::list<ccd::Json::Value,std::allocator<ccd::Json::Value>>::
              emplace_back<int&>((list<ccd::Json::Value,std::allocator<ccd::Json::Value>> *)
                                 &local_70,(int *)&value_1);
            }
          }
          else {
            pcVar5 = (char *)std::__cxx11::string::at((ulong)jsonString);
            if (*pcVar5 == '[') {
              std::__cxx11::string::substr((ulong)&subObject,(ulong)jsonString);
              iVar9 = 0;
              iVar8 = 0;
              for (_Var6._M_storage = 0.0; iVar10 = iVar9,
                  subObject.m_value.
                  super__Variant_base<int,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>,_std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>_>
                  .
                  super__Move_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
                  .
                  super__Copy_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
                  .
                  super__Move_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
                  .
                  super__Copy_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
                  .
                  super__Variant_storage_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
                  ._M_u._M_rest._M_first._M_storage !=
                  (_Uninitialized<double,_true>)_Var6._M_storage;
                  _Var6._M_storage = _Var6._M_storage + 1) {
                iVar8 = iVar8 + (uint)(*(char *)(subObject._0_8_ + (long)_Var6._M_storage) == '[');
                iVar9 = iVar9 + (uint)(*(char *)(subObject._0_8_ + (long)_Var6._M_storage) == ']');
                iVar10 = iVar8;
                if (iVar8 == iVar9) break;
              }
              std::__cxx11::string::~string((string *)&subObject);
              if (iVar8 != iVar10) {
                poVar7 = std::operator<<((ostream *)&std::cout,"could not tell end of new subObject"
                                        );
                std::endl<char,std::char_traits<char>>(poVar7);
                Value::Value(__return_storage_ptr__,(nullptr_t)0x0);
                goto LAB_00114977;
              }
              std::__cxx11::string::substr((ulong)&value_1,(ulong)jsonString);
              arrayFromString(&subObject,(string *)&value_1);
              std::__cxx11::string::~string((string *)&value_1);
              std::__cxx11::list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>::push_back
                        ((list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_> *)&local_70,
                         &subObject);
              std::__detail::__variant::
              _Variant_storage<false,_int,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>,_std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>_>
              ::~_Variant_storage((_Variant_storage<false,_int,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>,_std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>_>
                                   *)&subObject.m_value);
            }
            else {
              pcVar5 = (char *)std::__cxx11::string::at((ulong)jsonString);
              if (*pcVar5 == ']') goto LAB_0011484c;
              pcVar5 = (char *)std::__cxx11::string::at((ulong)jsonString);
              if (*pcVar5 == 't') {
                iVar8 = std::__cxx11::string::compare((ulong)jsonString,uVar4,(char *)0x4);
                if (iVar8 == 0) {
                  subObject.m_type._0_1_ = 1;
                  std::__cxx11::list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>::
                  emplace_back<bool>((list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_> *)
                                     &local_70,(bool *)&subObject);
                }
              }
              else {
                pcVar5 = (char *)std::__cxx11::string::at((ulong)jsonString);
                if (*pcVar5 == 'f') {
                  iVar8 = std::__cxx11::string::compare((ulong)jsonString,uVar4,(char *)0x5);
                  if (iVar8 == 0) {
                    subObject._0_8_ = subObject._0_8_ & 0xffffffffffffff00;
                    std::__cxx11::list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>::
                    emplace_back<bool>((list<ccd::Json::Value,_std::allocator<ccd::Json::Value>_> *)
                                       &local_70,(bool *)&subObject);
                  }
                }
                else {
                  pcVar5 = (char *)std::__cxx11::string::at((ulong)jsonString);
                  if (*pcVar5 != 'n') {
                    poVar7 = std::operator<<((ostream *)&std::cout,"invalid value ");
                    pcVar5 = (char *)std::__cxx11::string::at((ulong)jsonString);
                    poVar7 = std::operator<<(poVar7,*pcVar5);
                    poVar7 = std::operator<<(poVar7," offset ");
                    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                    poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
                    poVar7 = std::operator<<(poVar7,(string *)jsonString);
                    std::endl<char,std::char_traits<char>>(poVar7);
                    goto LAB_001148c9;
                  }
                  iVar8 = std::__cxx11::string::compare((ulong)jsonString,uVar4,(char *)0x4);
                  if (iVar8 == 0) {
                    subObject.m_type = Int;
                    subObject._4_4_ = 0;
                    std::__cxx11::list<ccd::Json::Value,std::allocator<ccd::Json::Value>>::
                    emplace_back<decltype(nullptr)>
                              ((list<ccd::Json::Value,std::allocator<ccd::Json::Value>> *)&local_70,
                               (void **)&subObject);
                  }
                }
              }
            }
          }
        }
      }
      subObject._0_8_ =
           (long)&subObject.m_value.
                  super__Variant_base<int,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>,_std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>_>
                  .
                  super__Move_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
                  .
                  super__Copy_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
                  .
                  super__Move_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
                  .
                  super__Copy_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
           + 8;
      subObject.m_value.
      super__Variant_base<int,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>,_std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>_>
      .
      super__Move_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
      .
      super__Copy_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
      .
      super__Move_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
      .
      super__Copy_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
      .
      super__Variant_storage_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
      ._M_u._8_4_ = 0xd0a0920;
      subObject.m_value.
      super__Variant_base<int,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>,_std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>_>
      .
      super__Move_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
      .
      super__Copy_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
      .
      super__Move_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
      .
      super__Copy_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
      .
      super__Variant_storage_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
      ._M_u._M_rest._0_8_ = (undefined8)1.97626258336499e-323;
      subObject.m_value.
      super__Variant_base<int,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>,_std::vector<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>_>
      .
      super__Move_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
      .
      super__Copy_assign_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
      .
      super__Move_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
      .
      super__Copy_ctor_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
      .
      super__Variant_storage_alias<int,_double,_bool,_std::__cxx11::basic_string<char>,_std::map<std::__cxx11::basic_string<char>,_ccd::Json::Value>,_std::vector<ccd::Json::Value>_>
      ._M_u._12_1_ = 0;
      std::__cxx11::string::find_first_not_of((string *)jsonString,(ulong)&subObject);
      std::__cxx11::string::~string((string *)&subObject);
      pcVar5 = (char *)std::__cxx11::string::at((ulong)jsonString);
      if (*pcVar5 == ']') goto LAB_0011484c;
      pcVar5 = (char *)std::__cxx11::string::at((ulong)jsonString);
    } while (*pcVar5 == ',');
    poVar7 = std::operator<<((ostream *)&std::cout,"syntax error!");
    std::endl<char,std::char_traits<char>>(poVar7);
    std::__cxx11::string::substr((ulong)&subObject,(ulong)jsonString);
    std::operator<<((ostream *)&std::cout,(string *)&subObject);
    std::__cxx11::string::~string((string *)&subObject);
LAB_001148c9:
    Value::Value(__return_storage_ptr__,(nullptr_t)0x0);
  }
LAB_00114977:
  std::__cxx11::_List_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>::_M_clear(&local_70)
  ;
  return __return_storage_ptr__;
}

Assistant:

Value arrayFromString(const std::string& jsonString)
{
	// make shure that decimal delimiter is a dot '.'
	std::setlocale(LC_NUMERIC, "C");

	auto arrayValues = std::list<Value>{};

	// check the borders
	auto beginPos = jsonString.find_first_of('[');
	auto endPos = jsonString.find_last_of(']');

	// if borders can not be defined something is wrong
	if (beginPos == string::npos || endPos == string::npos) {
		cout << "can't tell beginning or end of array" << endl;
		return nullptr;
	}

	// offset is one position after the beginning border
	auto offset = beginPos + 1;

	// find the first character
	beginPos = jsonString.find_first_not_of({ ' ', 9, 10 , 13 }, offset);

	// if no usefull character could be found position is set to npos
	while (beginPos != string::npos) {
		offset = beginPos;
		// it could be ne new sub object
		if (jsonString.at(offset) == '{') {
			auto newBeginPos = offset;
			auto newEndPos = offset;
			auto openCount = 0;
			auto closeCount = 0;

			// find the enclosing curly braces
			for (auto character : jsonString.substr(offset)) {
				if (character == '{')
					openCount++;
				if (character == '}')
					closeCount++;
				// if the count of close and open curly braces is equeal
				// we have found the position of the closing one
				if (openCount == closeCount)
					break;
				newEndPos++;
			}

			// if the count is different there is a syntax error
			if (openCount != closeCount) {
				cout << "could not tell end of new subObject" << endl;
				return nullptr;
			}

			// if everything went right, set the dataName and start a new
			// objectFromJson querry recursively
			auto subObject = objectFromString(jsonString.substr(newBeginPos,
				newEndPos - newBeginPos + 1));
			if (subObject.type() == Value::Type::Null) {
				std::cout << "subObject ist nullptr" << std::endl;
				return nullptr;
			}
			arrayValues.push_back(move(subObject));
			// set the offset to one position after the closing curly braces 
			offset = newEndPos + 1;
		}
		// it could be a string value
		else if (jsonString.at(offset) == '"') {
			// find the value borders
			auto beginOfValue = offset + 1;
			auto endOfValue = jsonString.find_first_of('"', offset + 1);
			if (endOfValue == string::npos) {
				cout << "cant find end of value" << endl;
				return nullptr;
			}

			// save the found value
			auto value = jsonString.substr(beginOfValue, endOfValue - beginOfValue);

			// add the found data to the object struct map
			arrayValues.emplace_back(move(value));

			// set the offset to one position after the end of value
			offset = endOfValue + 1;
		}
		// it could be a numerical value
		else if (isdigit(jsonString.at(offset)) || (jsonString.at(offset) == '-')) {
			auto tempPos = offset;
			offset++;
			while (isdigit(jsonString.at(offset))) {
				offset++;
			}

			if (jsonString.at(offset) == '.') {
				offset++;

				if (!isdigit(jsonString.at(offset))) {
					std::cout << "exptected digit" << std::endl;
					return nullptr;
				}
				offset++;
				while (isdigit(jsonString.at(offset))) {
					offset++;
				}
				//save the found double
				auto value = stod(jsonString.substr(tempPos, offset - tempPos));
				// add the found data to the object struct map
				arrayValues.emplace_back(value);
			}
			else {
				// save the found int
				auto value = stoi(jsonString.substr(tempPos, offset - tempPos));
				// add the found data to the object struct map
				arrayValues.emplace_back(value);
			}
		}
		//it could be an array
		else if (jsonString.at(offset) == '[') {
			
			auto newEndPos = offset;
			auto openCount = 0;
			auto closeCount = 0;

			// find the enclosing curly braces
			for (auto character : jsonString.substr(offset)) {
				if (character == '[')
					openCount++;
				if (character == ']')
					closeCount++;
				// if the count of close and open curly braces is equeal
				// we have found the position of the closing one
				if (openCount == closeCount)
					break;
				newEndPos++;
			}

			// if the count is different there is a syntax error
			if (openCount != closeCount) {
				cout << "could not tell end of new subObject" << endl;
				return nullptr;
			}
			auto value = arrayFromString(jsonString.substr(offset));
			arrayValues.push_back(move(value));

			offset = newEndPos + 1;
		}
		else if (jsonString.at(offset) == ']') {
			break;
		}
		else if (jsonString.at(offset) == 't') {
			if (jsonString.compare(offset, 4, "true") == 0) {
				arrayValues.emplace_back(true);
				offset += 4;
			}
			else
				offset++;
		}
		else if (jsonString.at(offset) == 'f') {
			if (jsonString.compare(offset, 5, "false") == 0) {
				arrayValues.emplace_back(false);
				offset += 5;
			}
			else
				offset++;
		}
		else if (jsonString.at(offset) == 'n') {
			if (jsonString.compare(offset, 4, "null") == 0) {
				arrayValues.emplace_back(nullptr);
				offset += 4;
			}
			else
				offset++;
		}
		else {
			cout 	<< "invalid value " << jsonString.at(offset) 
				<< " offset " << offset << endl
				<< jsonString << std::endl;
			return nullptr;
		}

		// find the next character
		offset = jsonString.find_first_not_of({ ' ', 9, 10 , 13 }, offset);

		// is it a closing curly braces we reached the end of the object and we are done
		if (jsonString.at(offset) == ']')
			break;
		// if a comma is next more values are following
		else if (jsonString.at(offset) == ',') {
			beginPos = jsonString.find_first_not_of({ ' ', 9, 10 , 13 }, offset + 1);
			continue;
		}
		// else syntax error
		else {
			std::cout << "syntax error!" << std::endl;
			std::cout << jsonString.substr(offset);
			return nullptr;
		}
	}

	return Array { 
		std::make_move_iterator(std::begin(arrayValues)),
		std::make_move_iterator(std::end(arrayValues))
	};
}